

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O0

void __thiscall QOpenGLTexturePrivate::setWrapMode(QOpenGLTexturePrivate *this,WrapMode mode)

{
  int iVar1;
  undefined4 in_ESI;
  long in_RDI;
  GLenum unaff_retaddr;
  GLenum unaff_retaddr_00;
  GLenum in_stack_00000008;
  GLint GVar2;
  
  iVar1 = *(int *)(in_RDI + 0x10);
  GVar2 = (GLint)((ulong)in_RDI >> 0x20);
  if (iVar1 == 0xde0) goto LAB_0018a973;
  if (iVar1 != 0xde1) {
    if (iVar1 == 0x806f) {
      *(undefined4 *)(in_RDI + 0x80) = in_ESI;
      *(undefined4 *)(in_RDI + 0x7c) = in_ESI;
      *(undefined4 *)(in_RDI + 0x78) = in_ESI;
      QOpenGLTextureHelper::glTextureParameteri
                ((QOpenGLTextureHelper *)this,mode,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                 GVar2);
      GVar2 = (GLint)((ulong)in_RDI >> 0x20);
      QOpenGLTextureHelper::glTextureParameteri
                ((QOpenGLTextureHelper *)this,mode,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                 GVar2);
      QOpenGLTextureHelper::glTextureParameteri
                ((QOpenGLTextureHelper *)this,mode,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                 GVar2);
      return;
    }
    if ((iVar1 != 0x84f5) && (iVar1 != 0x8513)) {
      if (iVar1 == 0x8c18) {
LAB_0018a973:
        *(undefined4 *)(in_RDI + 0x78) = in_ESI;
        QOpenGLTextureHelper::glTextureParameteri
                  ((QOpenGLTextureHelper *)this,mode,in_stack_00000008,unaff_retaddr_00,
                   unaff_retaddr,GVar2);
        return;
      }
      if (iVar1 != 0x8c1a) {
        if (iVar1 == 0x8c2a) goto LAB_0018a973;
        if (((iVar1 != 0x9009) && (iVar1 != 0x9100)) && (iVar1 != 0x9102)) {
          return;
        }
      }
    }
  }
  *(undefined4 *)(in_RDI + 0x7c) = in_ESI;
  *(undefined4 *)(in_RDI + 0x78) = in_ESI;
  QOpenGLTextureHelper::glTextureParameteri
            ((QOpenGLTextureHelper *)this,mode,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
             GVar2);
  QOpenGLTextureHelper::glTextureParameteri
            ((QOpenGLTextureHelper *)this,mode,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
             (GLint)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

void QOpenGLTexturePrivate::setWrapMode(QOpenGLTexture::WrapMode mode)
{
    switch (target) {
    case QOpenGLTexture::Target1D:
    case QOpenGLTexture::Target1DArray:
    case QOpenGLTexture::TargetBuffer:
        wrapModes[0] = mode;
        texFuncs->glTextureParameteri(textureId, target, bindingTarget, GL_TEXTURE_WRAP_S, mode);
        break;

    case QOpenGLTexture::Target2D:
    case QOpenGLTexture::Target2DArray:
    case QOpenGLTexture::TargetCubeMap:
    case QOpenGLTexture::TargetCubeMapArray:
    case QOpenGLTexture::Target2DMultisample:
    case QOpenGLTexture::Target2DMultisampleArray:
    case QOpenGLTexture::TargetRectangle:
        wrapModes[0] = wrapModes[1] = mode;
        texFuncs->glTextureParameteri(textureId, target, bindingTarget, GL_TEXTURE_WRAP_S, mode);
        texFuncs->glTextureParameteri(textureId, target, bindingTarget, GL_TEXTURE_WRAP_T, mode);
        break;

    case QOpenGLTexture::Target3D:
        wrapModes[0] = wrapModes[1] = wrapModes[2] = mode;
        texFuncs->glTextureParameteri(textureId, target, bindingTarget, GL_TEXTURE_WRAP_S, mode);
        texFuncs->glTextureParameteri(textureId, target, bindingTarget, GL_TEXTURE_WRAP_T, mode);
        texFuncs->glTextureParameteri(textureId, target, bindingTarget, GL_TEXTURE_WRAP_R, mode);
        break;
    }
}